

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O0

int __thiscall
wigwag::detail::
signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::connect(signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
          *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  signal_attributes val;
  runtime_error *this_00;
  lock_primitive *this_01;
  undefined4 in_register_00000034;
  signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  *this_02;
  uint in_R8D;
  anon_class_8_1_8991fb9c_for__f local_58;
  undefined1 local_50 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_detail_signal_impl_hpp:78:45)>
  sg;
  handler_attributes attributes_local;
  handler_type *handler_local;
  shared_ptr<wigwag::task_executor> *worker_local;
  signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  *this_local;
  
  this_02 = (signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
             *)CONCAT44(in_register_00000034,__fd);
  val = (*(this_02->super_signal_connector_impl<void_()>)._vptr_signal_connector_impl[6])();
  bVar1 = contains_flag<wigwag::signal_attributes>(val,connect_sync_only);
  if (!bVar1) {
    this_01 = get_lock_primitive(this_02);
    threading::own_recursive_mutex::lock_primitive::lock_nonrecursive(this_01);
    local_58.this = this_02;
    at_scope_exit<wigwag::detail::signal_impl<void(),wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>::connect(std::shared_ptr<wigwag::task_executor>,std::function<void()>,wigwag::handler_attributes)::_lambda()_1_>
              ((detail *)local_50,&local_58);
    listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
    ::
    create_node<wigwag::detail::signal_impl<void(),wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>::connect(std::shared_ptr<wigwag::task_executor>,std::function<void()>,wigwag::handler_attributes)::_lambda(wigwag::life_assurance::intrusive_life_tokens::life_checker)_1_>
              ((listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
                *)this,__fd + 8,(anon_class_32_4_c49eac36 *)(ulong)in_R8D);
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/include/wigwag/detail/signal_impl.hpp:78:45)>
    ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_detail_signal_impl_hpp:78:45)>
                    *)local_50);
    return (int)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"The signal restrains connecting asynchronous handlers!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual token connect(std::shared_ptr<task_executor> worker, handler_type handler, handler_attributes attributes)
        {
            if (contains_flag(this->get_attributes(), signal_attributes::connect_sync_only))
                WIGWAG_THROW("The signal restrains connecting asynchronous handlers!");

            this->get_lock_primitive().lock_nonrecursive();
            auto sg = detail::at_scope_exit([&] { this->get_lock_primitive().unlock_nonrecursive(); } );

            return this->create_node(attributes,
                    [&](life_checker lc) {
                        async_handler<Signature_, LifeAssurancePolicy_> real_handler(std::move(worker), std::move(lc), std::move(handler));
                        if (!contains_flag(attributes, handler_attributes::suppress_populator) && this->get_handler_processor().has_populate_state())
                            this->get_exception_handler().handle_exceptions([&] { this->get_handler_processor().populate_state(real_handler); });
                        return real_handler;
                    });
        }